

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

OnCallSpec<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> * __thiscall
testing::internal::
FunctionMocker<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>::FindOnCallSpec
          (FunctionMocker<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
           *this,ArgumentTuple *args)

{
  OnCallSpec<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *pOVar1;
  bool bVar2;
  pointer ppvVar3;
  MatchResultListener local_48;
  FunctionMocker<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *local_38;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = this;
  do {
    if (ppvVar3 ==
        (local_38->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return (OnCallSpec<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)0x0
      ;
    }
    pOVar1 = (OnCallSpec<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)
             ppvVar3[-1];
    local_48.stream_ = (ostream *)0x0;
    local_48._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00197638;
    bVar2 = MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
            MatchAndExplain((MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                             *)(pOVar1 + 0x10),
                            (args->
                            super__Tuple_impl<0UL,_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                            ).
                            super__Head_base<0UL,_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&,_false>
                            ._M_head_impl,&local_48);
    if (bVar2) {
      local_48.stream_ = (ostream *)0x0;
      local_48._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00197638;
      bVar2 = MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
              ::MatchAndExplain((MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
                                 *)(pOVar1 + 0x28),args,&local_48);
    }
    else {
      bVar2 = false;
    }
    ppvVar3 = ppvVar3 + -1;
  } while (bVar2 == false);
  return pOVar1;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return nullptr;
  }